

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

int av1_get_intrabc_extra_top_right_sb_delay(AV1_COMMON *cm)

{
  if (((((cm->current_frame).frame_type & 0xfd) == 0) &&
      ((cm->features).allow_screen_content_tools == true)) &&
     ((cm->features).allow_intrabc != false)) {
    return (uint)(cm->seq_params->sb_size != BLOCK_128X128) * 2 + 2;
  }
  return 0;
}

Assistant:

int av1_get_intrabc_extra_top_right_sb_delay(const AV1_COMMON *cm) {
  // No additional top-right delay when intraBC tool is not enabled.
  if (!av1_allow_intrabc(cm)) return 0;
  // Due to the hardware constraints on processing the intraBC tool with row
  // multithreading, a top-right delay of 3 superblocks of size 128x128 or 5
  // superblocks of size 64x64 is mandated. However, a minimum top-right delay
  // of 1 superblock is assured with 'sync_range'. Hence return only the
  // additional superblock delay when the intraBC tool is enabled.
  return cm->seq_params->sb_size == BLOCK_128X128 ? 2 : 4;
}